

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffobjs.c
# Opt level: O1

void cff_size_done(FT_Size cffsize)

{
  undefined8 *P;
  FT_Memory memory;
  FT_Driver pFVar1;
  PSH_Globals_Funcs pPVar2;
  ulong uVar3;
  
  P = (undefined8 *)cffsize->internal->module_data;
  if (P == (undefined8 *)0x0) {
    return;
  }
  memory = cffsize->face->memory;
  pFVar1 = cffsize->face[4].driver;
  pPVar2 = cff_size_get_globals_funcs((CFF_Size)cffsize);
  if (pPVar2 != (PSH_Globals_Funcs)0x0) {
    (*pPVar2->destroy)((PSH_Globals)*P);
    for (uVar3 = (ulong)*(uint *)&pFVar1[0x33].root.library; uVar3 != 0; uVar3 = uVar3 - 1) {
      (*pPVar2->destroy)((PSH_Globals)P[uVar3]);
    }
  }
  ft_mem_free(memory,P);
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cff_size_done( FT_Size  cffsize )        /* CFF_Size */
  {
    FT_Memory     memory   = cffsize->face->memory;
    CFF_Size      size     = (CFF_Size)cffsize;
    CFF_Face      face     = (CFF_Face)size->root.face;
    CFF_Font      font     = (CFF_Font)face->extra.data;
    CFF_Internal  internal = (CFF_Internal)cffsize->internal->module_data;


    if ( internal )
    {
      PSH_Globals_Funcs  funcs;


      funcs = cff_size_get_globals_funcs( size );
      if ( funcs )
      {
        FT_UInt  i;


        funcs->destroy( internal->topfont );

        for ( i = font->num_subfonts; i > 0; i-- )
          funcs->destroy( internal->subfonts[i - 1] );
      }

      FT_FREE( internal );
    }
  }